

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O2

size_t __thiscall adios2::transport::FileHTTP::GetSize(FileHTTP *this)

{
  FileHTTP *pFVar1;
  int iVar2;
  ssize_t sVar3;
  allocator local_567;
  allocator local_566;
  allocator local_565;
  int local_564;
  string local_560;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  FileHTTP *local_4e0;
  string local_4d8;
  char buffer [128];
  char request [1024];
  
  buffer[0x70] = '\0';
  buffer[0x71] = '\0';
  buffer[0x72] = '\0';
  buffer[0x73] = '\0';
  buffer[0x74] = '\0';
  buffer[0x75] = '\0';
  buffer[0x76] = '\0';
  buffer[0x77] = '\0';
  buffer[0x78] = '\0';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  buffer[0x7c] = '\0';
  buffer[0x7d] = '\0';
  buffer[0x7e] = '\0';
  buffer[0x7f] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  buffer[100] = '\0';
  buffer[0x65] = '\0';
  buffer[0x66] = '\0';
  buffer[0x67] = '\0';
  buffer[0x68] = '\0';
  buffer[0x69] = '\0';
  buffer[0x6a] = '\0';
  buffer[0x6b] = '\0';
  buffer[0x6c] = '\0';
  buffer[0x6d] = '\0';
  buffer[0x6e] = '\0';
  buffer[0x6f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_564 = snprintf(request,0x400,"GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n",
                       (this->super_Transport).m_Name._M_dataplus._M_p,
                       (this->m_hostname)._M_dataplus._M_p);
  if (0x3ff < local_564) {
    std::__cxx11::string::string((string *)&local_540,"Toolkit",&local_565);
    std::__cxx11::string::string((string *)&local_500,"transport::file::FileHTTP",&local_566);
    std::__cxx11::string::string((string *)&local_560,"GetSize",&local_567);
    std::__cxx11::to_string(&local_4d8,local_564);
    std::operator+(&local_520,"request length too long:  ",&local_4d8);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_540,&local_500,&local_560,&local_520,-1)
    ;
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_540);
  }
  iVar2 = socket(2,1,this->m_p_proto);
  this->m_socketFileDescriptor = iVar2;
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_540,"Toolkit",(allocator *)&local_4d8);
    std::__cxx11::string::string((string *)&local_500,"transport::file::FileHTTP",&local_565);
    std::__cxx11::string::string((string *)&local_560,"GetSize",&local_566);
    std::__cxx11::string::string((string *)&local_520,"cannot bind socket",&local_567);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_540,&local_500,&local_560,&local_520,-1)
    ;
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_540);
    iVar2 = this->m_socketFileDescriptor;
  }
  iVar2 = connect(iVar2,(sockaddr *)&this->sockaddr_in,0x10);
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_540,"Toolkit",(allocator *)&local_4d8);
    std::__cxx11::string::string((string *)&local_500,"transport::file::FileHTTP",&local_565);
    std::__cxx11::string::string((string *)&local_560,"GetSize",&local_566);
    std::__cxx11::string::string((string *)&local_520,"cannot connect",&local_567);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_540,&local_500,&local_560,&local_520,-1)
    ;
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_540);
  }
  local_4e0 = this;
  for (iVar2 = 0; pFVar1 = local_4e0, local_564 - iVar2 != 0 && iVar2 <= local_564;
      iVar2 = iVar2 + (int)sVar3) {
    sVar3 = write(local_4e0->m_socketFileDescriptor,request + iVar2,(long)(local_564 - iVar2));
    if ((int)sVar3 == -1) {
      std::__cxx11::string::string((string *)&local_540,"Toolkit",(allocator *)&local_4d8);
      std::__cxx11::string::string((string *)&local_500,"transport::file::FileHTTP",&local_565);
      std::__cxx11::string::string((string *)&local_560,"GetSize",&local_566);
      std::__cxx11::string::string((string *)&local_520,"sending request failed",&local_567);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_540,&local_500,&local_560,&local_520,-1);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_540);
    }
  }
  do {
    sVar3 = read(pFVar1->m_socketFileDescriptor,buffer,0x80);
  } while (0 < (int)sVar3);
  if ((int)sVar3 == -1) {
    std::__cxx11::string::string((string *)&local_540,"Toolkit",(allocator *)&local_4d8);
    std::__cxx11::string::string((string *)&local_500,"transport::file::FileHTTP",&local_565);
    std::__cxx11::string::string((string *)&local_560,"GetSize",&local_566);
    std::__cxx11::string::string((string *)&local_520,"receiving response failed",&local_567);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_540,&local_500,&local_560,&local_520,-1)
    ;
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_540);
  }
  close(pFVar1->m_socketFileDescriptor);
  iVar2 = atoi(buffer);
  return (long)iVar2;
}

Assistant:

size_t FileHTTP::GetSize()
{
    char request_template[] = "GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n";
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024,
        BUF_SIZE = 128
    };
    char request[MAX_REQUEST_LEN];
    char buffer[BUF_SIZE] = {'\0'};
    int request_len =
        snprintf(request, MAX_REQUEST_LEN, request_template, m_Name.c_str(), m_hostname.c_str());
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot bind socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                                  "sending request failed");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    while ((nbytes_total = read(m_socketFileDescriptor, buffer, BUF_SIZE)) > 0)
        ;
    if (nbytes_total == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "receiving response failed");
    }
    close(m_socketFileDescriptor);
    size_t result = atoi(buffer);

    return result;
}